

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidget::closeEvent(QDockWidget *this,QCloseEvent *event)

{
  QDockWidgetPrivate *this_00;
  QDockWidgetPrivate *pQVar1;
  QMainWindow *pQVar2;
  bool bVar3;
  
  this_00 = *(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_00;
  if (this_00->state != (DragState *)0x0) {
    QDockWidgetPrivate::endDrag(this_00,Abort);
    pQVar1 = *(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8;
  }
  pQVar2 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                     (*(QObject **)&(pQVar1->super_QWidgetPrivate).field_0x10);
  bVar3 = true;
  if ((pQVar2 != (QMainWindow *)0x0) &&
     (((this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
       super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 1) == 0)) {
    bVar3 = (((pQVar2->super_QWidget).data)->widget_attributes & 0x8000) == 0;
  }
  (**(code **)(*(long *)event + 0x10))(event,bVar3);
  return;
}

Assistant:

void QDockWidget::closeEvent(QCloseEvent *event)
{
    Q_D(QDockWidget);
    if (d->state)
        d->endDrag(QDockWidgetPrivate::EndDragMode::Abort);

    // For non-closable widgets, don't allow closing, except when the mainwindow
    // is hidden, as otherwise an application wouldn't be able to be shut down.
    const QMainWindow *win = qobject_cast<QMainWindow*>(parentWidget());
    const bool canClose = (d->features & DockWidgetClosable)
                       || (!win || !win->isVisible());
    event->setAccepted(canClose);
}